

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Reader.hh
# Opt level: O1

uint64_t __thiscall
avro::ReaderImpl<avro::NullValidator>::readVarInt(ReaderImpl<avro::NullValidator> *this)

{
  ulong uVar1;
  byte bVar2;
  uint8_t val;
  byte local_2a;
  true_type local_29;
  
  local_2a = 0;
  bVar2 = 0;
  uVar1 = 0;
  do {
    BufferReader::read<unsigned_char>((BufferReader *)(this + 8),&local_2a,&local_29);
    uVar1 = uVar1 | (ulong)(local_2a & 0x7f) << (bVar2 & 0x3f);
    bVar2 = bVar2 + 7;
  } while ((char)local_2a < '\0');
  return uVar1;
}

Assistant:

uint64_t readVarInt() {
        uint64_t encoded = 0;
        uint8_t val = 0;
        int shift = 0;
        do {
            reader_.read(val);
            uint64_t newbits = static_cast<uint64_t>(val & 0x7f) << shift;
            encoded |= newbits;
            shift += 7;
        } while (val & 0x80);

        return encoded;
    }